

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadratic_roundtrip_test.cxx
# Opt level: O1

void quadratic_roundtrip_endec_test<cryptox::symmetric_algorithm<&EVP_aes_256_cfb128>>
               (size_t rounds)

{
  pointer puVar1;
  allocator_type *paVar2;
  size_type __n;
  bool bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_aes_256_cfb128>_> endec;
  allocator_type local_d1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_aes_256_cfb128>_> local_b8;
  
  cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_aes_256_cfb128>_>::
  endec_pair_tester(&local_b8);
  __n = 0;
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_d0,__n,&local_d1);
    puVar1 = local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (paVar2 = (allocator_type *)
                  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start; paVar2 != (allocator_type *)puVar1;
        paVar2 = paVar2 + 1) {
      RAND_bytes((uchar *)&local_d1,1);
      *paVar2 = local_d1;
    }
    cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_aes_256_cfb128>>::
    check_roundtrip<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((endec_pair_tester<cryptox::symmetric_algorithm<&EVP_aes_256_cfb128>> *)&local_b8,
               &local_d0);
    if ((allocator_type *)
        local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (allocator_type *)0x0) {
      operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    bVar3 = __n != rounds;
    __n = __n + 1;
  } while (bVar3);
  EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)
                      local_b8.decryptor.
                      super_basic_endec<cryptox::symmetric_algorithm<&EVP_aes_256_cfb128>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
                      .
                      super_evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cfb128>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
                      ._context);
  EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)
                      local_b8.encryptor.
                      super_basic_endec<cryptox::symmetric_algorithm<&EVP_aes_256_cfb128>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
                      .
                      super_evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cfb128>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
                      ._context);
  if (local_b8.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void quadratic_roundtrip_endec_test(const size_t rounds = 4096) {
	cryptox::tests::endec_pair_tester<Algorithm> endec;

	for (int i=0; i<=rounds; ++i) {
		using cryptox::detail::make_random_vector;
		endec.check_roundtrip(make_random_vector(i));
	}
}